

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  undefined1 auVar1 [16];
  wchar_t *__s;
  long lVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  wchar_t *pwVar6;
  long lVar7;
  size_t __n;
  wchar_t *__s1;
  unsigned_long *puVar8;
  undefined1 auVar9 [16];
  undefined1 local_58 [16];
  
  archive_mstring_copy_wcs(&entry->ae_fflags_text,flags);
  while ((uVar4 = (ulong)(uint)*flags, uVar4 < 0x2d &&
         ((0x100100000200U >> (uVar4 & 0x3f) & 1) != 0))) {
    flags = flags + 1;
  }
  local_58 = (undefined1  [16])0x0;
  pwVar6 = (wchar_t *)0x0;
  do {
    __s1 = flags;
    if ((int)uVar4 == 0) {
      entry->ae_fflags_set = local_58._0_8_;
      entry->ae_fflags_clear = local_58._8_8_;
      return pwVar6;
    }
    lVar7 = 0;
    while ((0x2c < (uint)uVar4 || ((0x100100000201U >> (uVar4 & 0x3f) & 1) == 0))) {
      lVar2 = lVar7 + 4;
      lVar7 = lVar7 + 4;
      uVar4 = (ulong)*(uint *)((long)__s1 + lVar2);
    }
    flags = (wchar_t *)((long)__s1 + lVar7);
    __n = lVar7 >> 2;
    for (puVar8 = &fileflags[0].set; __s = (wchar_t *)puVar8[-1], __s != (wchar_t *)0x0;
        puVar8 = puVar8 + 4) {
      sVar5 = wcslen(__s);
      if ((__n == sVar5) && (iVar3 = wmemcmp(__s1,__s,__n), iVar3 == 0)) {
        auVar1 = *(undefined1 (*) [16])puVar8;
        auVar9._0_8_ = auVar1._8_8_;
        auVar9._8_4_ = auVar1._0_4_;
        auVar9._12_4_ = auVar1._4_4_;
LAB_00116f1b:
        local_58 = local_58 | auVar9;
        break;
      }
      if ((__n == sVar5 - 2) && (iVar3 = wmemcmp(__s1,__s + 2,__n), iVar3 == 0)) {
        auVar9 = *(undefined1 (*) [16])puVar8;
        goto LAB_00116f1b;
      }
    }
    while ((uVar4 = (ulong)(uint)*flags, uVar4 < 0x2d &&
           ((0x100100000200U >> (uVar4 & 0x3f) & 1) != 0))) {
      flags = flags + 1;
    }
    if (__s == (wchar_t *)0x0 && pwVar6 == (wchar_t *)0x0) {
      pwVar6 = __s1;
    }
  } while( true );
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}